

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall
testing::internal::OnCallSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
::Matches(OnCallSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this,
         ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,BasicTestExpr<1>>>
                    ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x60) + 0x20))(*(long **)(this + 0x60),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }